

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<unsigned_short>,testing::Matcher<std::chrono::duration<long,std::ratio<1l,1000l>>>>,std::tuple<unsigned_short,std::chrono::duration<long,std::ratio<1l,1000l>>>>
               (tuple<testing::Matcher<unsigned_short>,_testing::Matcher<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                *matcher_tuple,
               tuple<unsigned_short,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
               *value_tuple)

{
  bool bVar1;
  
  bVar1 = MatcherBase<unsigned_short>::Matches
                    ((MatcherBase<unsigned_short> *)
                     &(matcher_tuple->
                      super__Tuple_impl<0UL,_testing::Matcher<unsigned_short>,_testing::Matcher<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                      ).super__Head_base<0UL,_testing::Matcher<unsigned_short>,_false>,
                     &(value_tuple->
                      super__Tuple_impl<0UL,_unsigned_short,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
                      ).super__Head_base<0UL,_unsigned_short,_false>._M_head_impl);
  if (bVar1) {
    bVar1 = MatcherBase<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::Matches
                      ((MatcherBase<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *)
                       matcher_tuple,(duration<long,_std::ratio<1L,_1000L>_> *)value_tuple);
    return bVar1;
  }
  return false;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple) &&
           std::get<N - 1>(matcher_tuple).Matches(std::get<N - 1>(value_tuple));
  }